

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlHandleUndeclaredEntity(xmlParserCtxtPtr ctxt,xmlChar *name)

{
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->standalone == 1) || ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
    xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name);
  }
  else if (ctxt->validate == 0) {
    if (((ctxt->loadsubset & 0xfffffff7U) == 0) &&
       ((ctxt->replaceEntities == 0 || ((ctxt->options & 0x800000U) != 0)))) {
      xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name,(xmlChar *)0x0
                   );
    }
    else {
      xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name);
    }
  }
  else {
    xmlValidityError(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",name,
                     (xmlChar *)0x0);
  }
  ctxt->valid = 0;
  return;
}

Assistant:

static void
xmlHandleUndeclaredEntity(xmlParserCtxtPtr ctxt, const xmlChar *name) {
    /*
     * [ WFC: Entity Declared ]
     * In a document without any DTD, a document with only an
     * internal DTD subset which contains no parameter entity
     * references, or a document with "standalone='yes'", the
     * Name given in the entity reference must match that in an
     * entity declaration, except that well-formed documents
     * need not declare any of the following entities: amp, lt,
     * gt, apos, quot.
     * The declaration of a parameter entity must precede any
     * reference to it.
     * Similarly, the declaration of a general entity must
     * precede any reference to it which appears in a default
     * value in an attribute-list declaration. Note that if
     * entities are declared in the external subset or in
     * external parameter entities, a non-validating processor
     * is not obligated to read and process their declarations;
     * for such documents, the rule that an entity must be
     * declared is a well-formedness constraint only if
     * standalone='yes'.
     */
    if ((ctxt->standalone == 1) ||
        ((ctxt->hasExternalSubset == 0) &&
         (ctxt->hasPErefs == 0))) {
        xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
                          "Entity '%s' not defined\n", name);
    } else if (ctxt->validate) {
        /*
         * [ VC: Entity Declared ]
         * In a document with an external subset or external
         * parameter entities with "standalone='no'", ...
         * ... The declaration of a parameter entity must
         * precede any reference to it...
         */
        xmlValidityError(ctxt, XML_ERR_UNDECLARED_ENTITY,
                         "Entity '%s' not defined\n", name, NULL);
    } else if ((ctxt->loadsubset & ~XML_SKIP_IDS) ||
               ((ctxt->replaceEntities) &&
                ((ctxt->options & XML_PARSE_NO_XXE) == 0))) {
        /*
         * Also raise a non-fatal error
         *
         * - if the external subset is loaded and all entity declarations
         *   should be available, or
         * - entity substition was requested without restricting
         *   external entity access.
         */
        xmlErrMsgStr(ctxt, XML_WAR_UNDECLARED_ENTITY,
                     "Entity '%s' not defined\n", name);
    } else {
        xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
                      "Entity '%s' not defined\n", name, NULL);
    }

    ctxt->valid = 0;
}